

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPathSeparator.h
# Opt level: O0

void __thiscall
HighsPathSeparator::HighsPathSeparator(HighsPathSeparator *this,HighsMipSolver *mipsolver)

{
  HighsSeparator *in_RSI;
  undefined8 *in_RDI;
  HighsUInt seed;
  HighsRandom *in_stack_ffffffffffffffe0;
  HighsMipSolver *in_stack_ffffffffffffffe8;
  
  HighsSeparator::HighsSeparator(in_RSI,in_stack_ffffffffffffffe8,(char *)in_stack_ffffffffffffffe0)
  ;
  *in_RDI = &PTR_separateLpSolution_0096dfe0;
  seed = (HighsUInt)((ulong)in_RDI >> 0x20);
  HighsRandom::HighsRandom(in_stack_ffffffffffffffe0,seed);
  HighsRandom::initialise(in_stack_ffffffffffffffe0,seed);
  return;
}

Assistant:

HighsPathSeparator(const HighsMipSolver& mipsolver)
      : HighsSeparator(mipsolver, "PathAggr sepa") {
    randgen.initialise(mipsolver.options_mip_->random_seed);
  }